

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_existing_object(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  _Object *p_Var5;
  uint64_t uVar6;
  View *pVVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  P<r_exec::View> local_b0;
  float local_a4;
  pthread_mutex_t *local_a0;
  undefined8 local_98;
  double local_88;
  double local_78;
  float local_68;
  float local_58;
  float local_48;
  View *this_00;
  
  p_Var2 = (view->super_View).object.object;
  (*p_Var2->_vptr__Object[0x11])(p_Var2);
  iVar4 = (*p_Var2->_vptr__Object[0x18])(p_Var2,this,0);
  this_00 = (View *)CONCAT44(extraout_var,iVar4);
  if (this_00 == (View *)0x0) {
    local_b0.object = (_Object *)view;
    std::__detail::
    _Insert<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&p_Var2[5].refCount,(value_type *)&local_b0);
    (*p_Var2->_vptr__Object[0x12])(p_Var2);
    inject(this,view);
  }
  else {
    (*p_Var2->_vptr__Object[0x12])(p_Var2);
    local_a0 = (pthread_mutex_t *)&this->mutex;
    std::mutex::lock((mutex *)&local_a0->__data);
    p_Var5 = (_Object *)operator_new(0x20);
    uVar6 = View::get_oid(this_00);
    fVar8 = View::get_res(view);
    local_98 = (vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>> *)
               &this->pending_operations;
    (p_Var5->refCount).super___atomic_base<long>._M_i = uVar6;
    *(undefined2 *)&p_Var5[1]._vptr__Object = 4;
    p_Var5[1].refCount.super___atomic_base<long>._M_i = (__int_type)(double)fVar8;
    p_Var5->_vptr__Object = (_func_int **)&PTR__Operation_001d1d10;
    local_b0.object = p_Var5;
    std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
    emplace_back<r_exec::Group::Operation*>(local_98,(Operation **)&local_b0);
    pVVar7 = (View *)operator_new(0x20);
    uVar6 = View::get_oid(this_00);
    fVar8 = View::get_sln(view);
    (pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i = uVar6;
    *(undefined2 *)(pVVar7->super_View).references = 3;
    (pVVar7->super_View).references[1] = (Code *)(double)fVar8;
    (pVVar7->super_View).super__Object._vptr__Object = (_func_int **)&PTR__Operation_001d1d10;
    local_b0.object = (_Object *)pVVar7;
    std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
    emplace_back<r_exec::Group::Operation*>(local_98,(Operation **)&local_b0);
    (*p_Var2->_vptr__Object[4])(p_Var2,0);
    cVar3 = r_code::Atom::getDescriptor();
    if ((byte)(cVar3 + 0x37U) < 6) {
      pVVar7 = (View *)operator_new(0x20);
      uVar6 = View::get_oid(this_00);
      fVar8 = View::get_act(view);
      (pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i = uVar6;
      *(undefined2 *)(pVVar7->super_View).references = 7;
      (pVVar7->super_View).references[1] = (Code *)(double)fVar8;
      (pVVar7->super_View).super__Object._vptr__Object = (_func_int **)&PTR__Operation_001d1d10;
      local_b0.object = (_Object *)pVVar7;
      std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
      emplace_back<r_exec::Group::Operation*>(local_98,(Operation **)&local_b0);
    }
    r_code::Atom::operator=
              ((Atom *)&(this_00->super_View).field_0x2c,(Atom *)&(view->super_View).field_0x2c);
    uVar6 = (*Now)();
    r_code::View::set_ijt((View *)this_00,uVar6);
    fVar8 = View::get_sln(view);
    local_98 = (vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>> *)
               CONCAT44(extraout_XMM0_Db,fVar8);
    local_48 = get_sln_thr(this);
    local_58 = View::get_sln(this_00);
    local_68 = get_sln_thr(this);
    local_78 = update_c_act(this);
    local_a4 = get_c_act_thr(this);
    local_88 = update_c_sln(this);
    fVar8 = get_c_sln_thr(this);
    if (((double)fVar8 < local_88 && (double)local_a4 < local_78) &&
        (local_48 < (float)local_98 && local_58 <= local_68)) {
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_b0.object = (_Object *)view;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::_M_insert_equal<core::P<r_exec::View>>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)&this->newly_salient_views,&local_b0);
      core::P<r_exec::View>::~P(&local_b0);
      inject_reduction_jobs(this,view);
    }
    pthread_mutex_unlock(local_a0);
  }
  return;
}

Assistant:

void Group::inject_existing_object(View *view)   // the view can hold anything but groups and notifications.
{
    Code *object = view->object;
    object->acq_views();
    View *existing_view = (View *)object->get_view(this, false);

    if (!existing_view) { // no existing view: add the view to the object's view_map and inject.
        object->views.insert(view);
        object->rel_views();
        inject(view);
    } else { // call set on the ctrl values of the existing view with the new view's ctrl values, including sync. NB: org left unchanged.
        object->rel_views();
        std::lock_guard<std::mutex> guard(mutex);
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_RES, view->get_res()));
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_SLN, view->get_sln()));

        switch (object->code(0).getDescriptor()) {
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_ACT, view->get_act()));
            break;
        }

        existing_view->code(VIEW_SYNC) = view->code(VIEW_SYNC);
        existing_view->set_ijt(Now());
        bool wiew_is_salient = view->get_sln() > get_sln_thr();
        bool wiew_was_salient = existing_view->get_sln() > get_sln_thr();
        bool reduce_view = (!wiew_was_salient && wiew_is_salient);
        // give a chance to ipgms to reduce the new view.
        bool group_is_c_active = update_c_act() > get_c_act_thr();
        bool group_is_c_salient = update_c_sln() > get_c_sln_thr();

        if (group_is_c_active && group_is_c_salient && reduce_view) {
            newly_salient_views.insert(view);
            inject_reduction_jobs(view);
        }
    }
}